

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

void __thiscall
Jupiter::IRC::Client::setPrimaryConfigSection(Client *this,Config *in_primary_section)

{
  string *__str;
  
  this->m_primary_section = in_primary_section;
  if (in_primary_section != (Config *)0x0) {
    __str = Config::getName_abi_cxx11_(in_primary_section);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->m_primary_section_name,__str);
    return;
  }
  (this->m_primary_section_name)._M_string_length = 0;
  *(this->m_primary_section_name)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void Jupiter::IRC::Client::setPrimaryConfigSection(Jupiter::Config *in_primary_section) {
	m_primary_section = in_primary_section;

	if (m_primary_section != nullptr)
		m_primary_section_name = m_primary_section->getName();
	else
		m_primary_section_name.clear();
}